

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_update_id(bcf_hdr_t *hdr,bcf1_t *line,char *id)

{
  int *piVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  ulong __size;
  
  pcVar6 = (line->d).id;
  uVar2 = (line->d).m_id;
  __size = (ulong)(int)uVar2;
  pcVar4 = pcVar6;
  if (id == (char *)0x0) {
    if (uVar2 < 3) {
      __size = 4;
      pcVar4 = (char *)realloc(pcVar6,4);
      if (pcVar4 == (char *)0x0) goto LAB_00124d92;
    }
    *pcVar4 = '.';
    pcVar6 = pcVar4 + 1;
  }
  else {
    sVar3 = strlen(id);
    sVar3 = (size_t)(int)sVar3;
    uVar5 = sVar3 + 1;
    if (__size <= uVar5) {
      uVar5 = uVar5 >> 1 | uVar5;
      uVar5 = uVar5 >> 2 | uVar5;
      uVar5 = uVar5 >> 4 | uVar5;
      uVar5 = uVar5 >> 8 | uVar5;
      __size = (uVar5 >> 0x10 | uVar5) + 1;
      pcVar4 = (char *)realloc(pcVar6,__size);
      if (pcVar4 == (char *)0x0) goto LAB_00124d92;
    }
    memcpy(pcVar4,id,sVar3);
    pcVar6 = pcVar4 + sVar3;
  }
  *pcVar6 = '\0';
  pcVar6 = pcVar4;
LAB_00124d92:
  (line->d).id = pcVar6;
  (line->d).m_id = (int)__size;
  piVar1 = &(line->d).shared_dirty;
  *(byte *)piVar1 = (byte)*piVar1 | 1;
  return 0;
}

Assistant:

int bcf_update_id(const bcf_hdr_t *hdr, bcf1_t *line, const char *id)
{
    kstring_t tmp;
    tmp.l = 0; tmp.s = line->d.id; tmp.m = line->d.m_id;
    if ( id )
        kputs(id, &tmp);
    else
        kputs(".", &tmp);
    line->d.id = tmp.s; line->d.m_id = tmp.m;
    line->d.shared_dirty |= BCF1_DIRTY_ID;
    return 0;
}